

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O2

int __thiscall
amrex::distFcnElement2d::solve_thomas
          (distFcnElement2d *this,vector<double,_std::allocator<double>_> *a,
          vector<double,_std::allocator<double>_> *b,vector<double,_std::allocator<double>_> *c,
          vector<double,_std::allocator<double>_> *d,vector<double,_std::allocator<double>_> *x)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  double dVar9;
  
  uVar7 = (long)(d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  iVar6 = (int)uVar7;
  uVar7 = uVar7 & 0xffffffff;
  std::vector<double,_std::allocator<double>_>::resize(x,uVar7);
  pdVar1 = (a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (c->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (uVar5 = 1; uVar5 < uVar7; uVar5 = uVar5 + 1) {
    pdVar3 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar9 = -pdVar1[uVar5 - 1] / pdVar3[uVar5 - 1];
    pdVar3[uVar5] = pdVar2[uVar5 - 1] * dVar9 + pdVar3[uVar5];
    pdVar3 = (d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[uVar5] = dVar9 * pdVar3[uVar5 - 1] + pdVar3[uVar5];
  }
  uVar8 = iVar6 - 1;
  pdVar1 = (d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3[uVar8] = pdVar1[uVar8] / pdVar2[uVar8];
  pdVar4 = (c->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (uVar8 = iVar6 - 2; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
    pdVar3[uVar8] = (pdVar1[uVar8] - pdVar4[uVar8] * pdVar3[(ulong)uVar8 + 1]) / pdVar2[uVar8];
  }
  return 0;
}

Assistant:

int distFcnElement2d::solve_thomas(const std::vector<amrex::Real> &a,
                                   std::vector<amrex::Real> b,
                                   const std::vector<amrex::Real> &c,
                                   std::vector<amrex::Real> d,
                                   std::vector<amrex::Real> &x) {
  unsigned n;
  n = d.size();
  x.resize(n);

  amrex::Real m;
  for (unsigned i=1; i < n; ++i) {
    m = a[i-1]/b[i-1];
    b[i] -= m*c[i-1];
    d[i] -= m*d[i-1];
  }

  x[n-1] = d[n-1] / b[n-1];

  for (int i=n-2; i > -1; --i) {
    x[i] = (d[i]-c[i]*x[i+1])/b[i];
  }

  return 0;
}